

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# split.cpp
# Opt level: O0

void __thiscall
SplitNTest_random_vector_Test<wchar_t>::SplitNTest_random_vector_Test
          (SplitNTest_random_vector_Test<wchar_t> *this)

{
  SplitNTest_random_vector_Test<wchar_t> *this_local;
  
  SplitNTest<wchar_t>::SplitNTest(&this->super_SplitNTest<wchar_t>);
  *(undefined ***)&this->super_SplitNTest<wchar_t> = &PTR__SplitNTest_random_vector_Test_0081c518;
  return;
}

Assistant:

TYPED_TEST(SplitNTest, random_vector) {
	RandomTestData<TypeParam, std::vector<TypeParam>> data{};
	constexpr size_t n = 4;
	std::vector<std::vector<TypeParam>> split_result = split_n<std::vector, std::vector<TypeParam>>(data.m_str, default_delim<TypeParam>, n);

	// Tokens shall be same up until last one (n + 1)
	EXPECT_EQ(split_result.size(), n + 1);
	for (size_t index = 0; index != n; ++index) {
		EXPECT_EQ(split_result[index], data.m_tokens[index]);
	}

	EXPECT_EQ(split_result[n], data.get_remainder(n));
}